

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

char * lws_get_peer_simple_fd(lws_sockfd_type fd,char *name,size_t namelen)

{
  undefined8 size;
  size_t str;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  socklen_t local_3c;
  undefined1 local_38 [4];
  socklen_t len;
  lws_sockaddr46 sa46;
  size_t namelen_local;
  char *name_local;
  char *pcStack_10;
  lws_sockfd_type fd_local;
  
  local_3c = 0x10;
  sa46.sa4.sin_zero = (uchar  [8])namelen;
  namelen_local = (size_t)name;
  name_local._4_4_ = fd;
  iVar1 = getpeername(fd,(sockaddr *)local_38,&local_3c);
  str = namelen_local;
  size = sa46.sa4.sin_zero;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    lws_snprintf((char *)str,size,"getpeername: %s",pcVar3);
    pcStack_10 = (char *)namelen_local;
  }
  else {
    lws_sa46_write_numeric_address
              ((lws_sockaddr46 *)local_38,(char *)namelen_local,(size_t)sa46.sa4.sin_zero);
    pcStack_10 = (char *)namelen_local;
  }
  return pcStack_10;
}

Assistant:

const char *
lws_get_peer_simple_fd(lws_sockfd_type fd, char *name, size_t namelen)
{
	lws_sockaddr46 sa46;
	socklen_t len = sizeof(sa46);

	if (getpeername(fd, (struct sockaddr *)&sa46, &len) < 0) {
		lws_snprintf(name, namelen, "getpeername: %s",
				strerror(LWS_ERRNO));
		return name;
	}

	lws_sa46_write_numeric_address(&sa46, name, namelen);

	return name;
}